

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_window.c
# Opt level: O0

zip_int64_t
window_read(zip_source_t *src,void *_ctx,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  int iVar1;
  zip_uint64_t zVar2;
  ulong uVar3;
  zip_int64_t zVar4;
  zip_int64_t *local_20a8;
  zip_uint64_t local_20a0;
  int local_2094;
  zip_stat_t *st;
  zip_source_args_seek_t *args;
  zip_int64_t new_offset;
  zip_uint8_t b [8192];
  zip_uint64_t offset;
  zip_uint64_t i;
  zip_uint64_t n;
  zip_int64_t ret;
  window *ctx;
  zip_uint64_t zStack_30;
  zip_source_cmd_t cmd_local;
  zip_uint64_t len_local;
  void *data_local;
  void *_ctx_local;
  zip_source_t *src_local;
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    if (*(long *)((long)_ctx + 0x18) != 0) {
      zVar2 = _zip_file_get_offset
                        (*(zip_t **)((long)_ctx + 0x18),*(zip_uint64_t *)((long)_ctx + 0x20),
                         (zip_error_t *)((long)_ctx + 0x98));
      if (zVar2 == 0) {
        return -1;
      }
      if (*(long *)((long)_ctx + 8) + zVar2 < *(ulong *)((long)_ctx + 8)) {
        if (*(ulong *)((long)_ctx + 0x20) < 0x800000) {
          local_2094 = (int)*(undefined8 *)((long)_ctx + 0x20);
        }
        else {
          local_2094 = 0x7fffff;
        }
        zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x15,local_2094 << 8 | 4);
        return -1;
      }
      *(zip_uint64_t *)_ctx = zVar2 + *_ctx;
      *(zip_uint64_t *)((long)_ctx + 8) = zVar2 + *(long *)((long)_ctx + 8);
      *(undefined8 *)((long)_ctx + 0x18) = 0;
    }
    if ((*(byte *)((long)_ctx + 0xb0) & 1) == 0) {
      for (i = 0; i < *_ctx; i = zVar4 + i) {
        if (*_ctx - i < 0x2001) {
          local_20a0 = *_ctx - i;
        }
        else {
          local_20a0 = 0x2000;
        }
        zVar4 = zip_source_read(src,&new_offset,local_20a0);
        if (zVar4 < 0) {
          zip_error_set_from_source((zip_error_t *)((long)_ctx + 0x98),src);
          return -1;
        }
        if (zVar4 == 0) {
          zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x11,0);
          return -1;
        }
      }
    }
    *(undefined8 *)((long)_ctx + 0x28) = *_ctx;
    src_local = (zip_source_t *)0x0;
    break;
  case ZIP_SOURCE_READ:
    zStack_30 = len;
    if (((*(byte *)((long)_ctx + 0x10) & 1) != 0) &&
       ((ulong)(*(long *)((long)_ctx + 8) - *(long *)((long)_ctx + 0x28)) < len)) {
      zStack_30 = *(long *)((long)_ctx + 8) - *(long *)((long)_ctx + 0x28);
    }
    if (zStack_30 == 0) {
      src_local = (zip_source_t *)0x0;
    }
    else if (((*(byte *)((long)_ctx + 0xb0) & 1) == 0) ||
            (iVar1 = zip_source_seek(src,*(zip_int64_t *)((long)_ctx + 0x28),0), -1 < iVar1)) {
      src_local = (zip_source_t *)zip_source_read(src,data,zStack_30);
      if ((long)src_local < 0) {
        zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x11,0);
        src_local = (zip_source_t *)0xffffffffffffffff;
      }
      else {
        *(long *)((long)_ctx + 0x28) = (long)&src_local->src + *(long *)((long)_ctx + 0x28);
        if (((src_local == (zip_source_t *)0x0) && ((*(byte *)((long)_ctx + 0x10) & 1) != 0)) &&
           (*(ulong *)((long)_ctx + 0x28) < *(ulong *)((long)_ctx + 8))) {
          zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x11,0);
          src_local = (zip_source_t *)0xffffffffffffffff;
        }
      }
    }
    else {
      zip_error_set_from_source((zip_error_t *)((long)_ctx + 0x98),src);
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    break;
  case ZIP_SOURCE_CLOSE:
    src_local = (zip_source_t *)0x0;
    break;
  case ZIP_SOURCE_STAT:
    iVar1 = _zip_stat_merge((zip_stat_t *)data,(zip_stat_t *)((long)_ctx + 0x30),
                            (zip_error_t *)((long)_ctx + 0x98));
    if (iVar1 < 0) {
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    else {
      if ((*(ulong *)((long)_ctx + 0x30) & 4) == 0) {
        if ((*(byte *)((long)_ctx + 0x10) & 1) == 0) {
          if ((*data & 4) != 0) {
            *(long *)((long)data + 0x18) = *(long *)((long)data + 0x18) - *_ctx;
          }
        }
        else {
          *(ulong *)data = *data | 4;
          *(long *)((long)data + 0x18) = *(long *)((long)_ctx + 8) - *_ctx;
        }
      }
      *(ulong *)data = (*(ulong *)((long)_ctx + 0x70) ^ 0xffffffffffffffff) & *data;
      src_local = (zip_source_t *)0x0;
    }
    break;
  case ZIP_SOURCE_ERROR:
    src_local = (zip_source_t *)zip_error_to_data((zip_error_t *)((long)_ctx + 0x98),data,len);
    break;
  case ZIP_SOURCE_FREE:
    free(_ctx);
    src_local = (zip_source_t *)0x0;
    break;
  case ZIP_SOURCE_SEEK:
    if ((*(byte *)((long)_ctx + 0x10) & 1) == 0) {
      local_20a8 = (zip_int64_t *)data;
      if (len < 0x10) {
        zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x12,0);
        local_20a8 = (zip_int64_t *)0x0;
      }
      if (local_20a8 == (zip_int64_t *)0x0) {
        return -1;
      }
      if ((int)local_20a8[1] == 2) {
        iVar1 = zip_source_seek(src,*local_20a8,(int)local_20a8[1]);
        if (iVar1 < 0) {
          zip_error_set_from_source((zip_error_t *)((long)_ctx + 0x98),src);
          return -1;
        }
        uVar3 = zip_source_tell(src);
        if ((long)uVar3 < 0) {
          zip_error_set_from_source((zip_error_t *)((long)_ctx + 0x98),src);
          return -1;
        }
        if (uVar3 < *_ctx) {
          zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x12,0);
          zip_source_seek(src,*(zip_int64_t *)((long)_ctx + 0x28),0);
          return -1;
        }
        *(ulong *)((long)_ctx + 0x28) = uVar3;
        return 0;
      }
    }
    zVar4 = zip_source_seek_compute_offset
                      (*(long *)((long)_ctx + 0x28) - *_ctx,*(long *)((long)_ctx + 8) - *_ctx,data,
                       len,(zip_error_t *)((long)_ctx + 0x98));
    if (zVar4 < 0) {
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    else {
      *(zip_int64_t *)((long)_ctx + 0x28) = zVar4 + *_ctx;
      src_local = (zip_source_t *)0x0;
    }
    break;
  case ZIP_SOURCE_TELL:
    src_local = (zip_source_t *)(*(long *)((long)_ctx + 0x28) - *_ctx);
    break;
  default:
    src_local = (zip_source_t *)zip_source_pass_to_lower_layer(src,data,len,cmd);
    break;
  case ZIP_SOURCE_SUPPORTS:
    src_local = *(zip_source_t **)((long)_ctx + 0xa8);
    break;
  case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
    if (len < 0x18) {
      zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x12,0);
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    else {
      *(undefined8 *)data = *(undefined8 *)((long)_ctx + 0x78);
      *(undefined8 *)((long)data + 8) = *(undefined8 *)((long)_ctx + 0x80);
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)((long)_ctx + 0x88);
      src_local = (zip_source_t *)0x18;
    }
    break;
  case ZIP_SOURCE_GET_DOS_TIME:
    if (len < 4) {
      zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x12,0);
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    else if ((*(byte *)((long)_ctx + 0x94) & 1) == 0) {
      src_local = (zip_source_t *)0x0;
    }
    else {
      *(undefined4 *)data = *(undefined4 *)((long)_ctx + 0x90);
      src_local = (zip_source_t *)0x4;
    }
  }
  return (zip_int64_t)src_local;
}

Assistant:

static zip_int64_t
window_read(zip_source_t *src, void *_ctx, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct window *ctx;
    zip_int64_t ret;
    zip_uint64_t n, i;

    ctx = (struct window *)_ctx;

    switch (cmd) {
    case ZIP_SOURCE_CLOSE:
        return 0;

    case ZIP_SOURCE_ERROR:
        return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
        free(ctx);
        return 0;

    case ZIP_SOURCE_OPEN:
        if (ctx->source_archive) {
            zip_uint64_t offset;

            if ((offset = _zip_file_get_offset(ctx->source_archive, ctx->source_index, &ctx->error)) == 0) {
                return -1;
            }
            if (ctx->end + offset < ctx->end) {
                /* zip archive data claims end of data past zip64 limits */
                zip_error_set(&ctx->error, ZIP_ER_INCONS, MAKE_DETAIL_WITH_INDEX(ZIP_ER_DETAIL_CDIR_ENTRY_INVALID, ctx->source_index));
                return -1;
            }
            ctx->start += offset;
            ctx->end += offset;
            ctx->source_archive = NULL;
        }

        if (!ctx->needs_seek) {
            DEFINE_BYTE_ARRAY(b, BUFSIZE);

            if (!byte_array_init(b, BUFSIZE)) {
                zip_error_set(&ctx->error, ZIP_ER_MEMORY, 0);
                return -1;
            }

            for (n = 0; n < ctx->start; n += (zip_uint64_t)ret) {
                i = (ctx->start - n > BUFSIZE ? BUFSIZE : ctx->start - n);
                if ((ret = zip_source_read(src, b, i)) < 0) {
                    zip_error_set_from_source(&ctx->error, src);
                    byte_array_fini(b);
                    return -1;
                }
                if (ret == 0) {
                    zip_error_set(&ctx->error, ZIP_ER_EOF, 0);
                    byte_array_fini(b);
                    return -1;
                }
            }

            byte_array_fini(b);
        }

        ctx->offset = ctx->start;
        return 0;

    case ZIP_SOURCE_READ:
        if (ctx->end_valid && len > ctx->end - ctx->offset) {
            len = ctx->end - ctx->offset;
        }

        if (len == 0) {
            return 0;
        }

        if (ctx->needs_seek) {
            if (zip_source_seek(src, (zip_int64_t)ctx->offset, SEEK_SET) < 0) {
                zip_error_set_from_source(&ctx->error, src);
                return -1;
            }
        }

        if ((ret = zip_source_read(src, data, len)) < 0) {
            zip_error_set(&ctx->error, ZIP_ER_EOF, 0);
            return -1;
        }

        ctx->offset += (zip_uint64_t)ret;

        if (ret == 0) {
            if (ctx->end_valid && ctx->offset < ctx->end) {
                zip_error_set(&ctx->error, ZIP_ER_EOF, 0);
                return -1;
            }
        }
        return ret;

    case ZIP_SOURCE_SEEK: {
        zip_int64_t new_offset;
        
        if (!ctx->end_valid) {
            zip_source_args_seek_t *args = ZIP_SOURCE_GET_ARGS(zip_source_args_seek_t, data, len, &ctx->error);
            
            if (args == NULL) {
                return -1;
            }
            if (args->whence == SEEK_END) {
                if (zip_source_seek(src, args->offset, args->whence) < 0) {
                    zip_error_set_from_source(&ctx->error, src);
                    return -1;
                }
                new_offset = zip_source_tell(src);
                if (new_offset < 0) {
                    zip_error_set_from_source(&ctx->error, src);
                    return -1;
                }
                if ((zip_uint64_t)new_offset < ctx->start) {
                    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
                    (void)zip_source_seek(src, (zip_int64_t)ctx->offset, SEEK_SET);
                    return -1;
                }
                ctx->offset = (zip_uint64_t)new_offset;
                return 0;
            }
        }

        new_offset = zip_source_seek_compute_offset(ctx->offset - ctx->start, ctx->end - ctx->start, data, len, &ctx->error);
        
        if (new_offset < 0) {
            return -1;
        }
        
        ctx->offset = (zip_uint64_t)new_offset + ctx->start;
        return 0;
    }

    case ZIP_SOURCE_STAT: {
        zip_stat_t *st;

        st = (zip_stat_t *)data;

        if (_zip_stat_merge(st, &ctx->stat, &ctx->error) < 0) {
            return -1;
        }

        if (!(ctx->stat.valid & ZIP_STAT_SIZE)) {
            if (ctx->end_valid) {
                st->valid |= ZIP_STAT_SIZE;
                st->size = ctx->end - ctx->start;
            }
            else if (st->valid & ZIP_STAT_SIZE) {
                st->size -= ctx->start;
            }
        }

        st->valid &= ~ctx->stat_invalid;

        return 0;
    }

    case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
        if (len < sizeof(ctx->attributes)) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }

        (void)memcpy_s(data, sizeof(ctx->attributes), &ctx->attributes, sizeof(ctx->attributes));
        return sizeof(ctx->attributes);

    case ZIP_SOURCE_GET_DOS_TIME:
        if (len < sizeof(ctx->dostime)) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }
        if (ctx->dostime_valid) {
            (void)memcpy_s(data, sizeof(ctx->dostime), &ctx->dostime, sizeof(ctx->dostime));
            return sizeof(ctx->dostime);
        }
        else {
            return 0;
        }

    case ZIP_SOURCE_SUPPORTS:
        return ctx->supports;

    case ZIP_SOURCE_TELL:
        return (zip_int64_t)(ctx->offset - ctx->start);

    default:
        return zip_source_pass_to_lower_layer(src, data, len, cmd);
    }
}